

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::configCommandBuffer(TransferTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  VkDeviceSize VVar2;
  VkDeviceSize VVar3;
  VkResult VVar4;
  DeviceInterface *pDVar5;
  pointer pVVar6;
  uint uVar7;
  VkImageSubresourceRange *pVVar8;
  VkImageSubresourceRange *pVVar9;
  undefined8 uVar11;
  deUint32 dVar12;
  VkClearColorValue srcClearValue;
  VkImageSubresourceRange subRangeDepth;
  VkImageSubresourceRange subRangeColor;
  VkClearColorValue dstClearValue;
  VkBufferCopy copyBufRegion;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined4 uVar10;
  
  pDVar5 = Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  VVar4 = (*pDVar5->_vptr_DeviceInterface[0x49])
                    (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x77c);
  (*pDVar5->_vptr_DeviceInterface[0x65])
            (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,this->m_bufSize,0);
  srcClearValue._0_8_ = &DAT_3f8000003f800000;
  srcClearValue._8_8_ = &DAT_3f8000003f800000;
  dstClearValue._0_8_ = 0;
  dstClearValue._8_8_ = 0;
  pVVar9 = &subRangeColor;
  subRangeColor.aspectMask = 1;
  subRangeColor.baseMipLevel = 0;
  subRangeColor.levelCount = 1;
  subRangeColor.baseArrayLayer = 0;
  subRangeDepth.layerCount = 1;
  subRangeDepth.aspectMask = 2;
  subRangeDepth.baseMipLevel = 0;
  subRangeDepth.levelCount = 1;
  subRangeDepth.baseArrayLayer = 0;
  subRangeColor.layerCount = subRangeDepth.layerCount;
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
            (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                  super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1);
  uVar11 = subRangeColor._8_8_;
  dVar12 = subRangeColor.layerCount;
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
            (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                  super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1);
  (*pDVar5->_vptr_DeviceInterface[0x66])
            (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1,&srcClearValue,1,pVVar9,uVar11,dVar12);
  pVVar8 = pVVar9;
  (*pDVar5->_vptr_DeviceInterface[0x66])
            (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,1,&dstClearValue,1,pVVar9);
  uVar10 = (undefined4)((ulong)pVVar8 >> 0x20);
  (*pDVar5->_vptr_DeviceInterface[0x70])
            (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->super_TimestampTestInstance).m_queryPool.
             super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,8);
  if (this->m_method < TRANSFER_METHOD_LAST) {
    VVar3._0_4_ = this->m_imageWidth;
    VVar3._4_4_ = this->m_imageHeight;
    VVar2._0_4_ = this->m_imageWidth;
    VVar2._4_4_ = this->m_imageHeight;
    switch(this->m_method) {
    case TRANSFER_METHOD_COPY_BUFFER:
      copyBufRegion.srcOffset = 0;
      copyBufRegion.dstOffset = 0;
      copyBufRegion.size = 0x200;
      (*pDVar5->_vptr_DeviceInterface[0x5f])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,1);
      break;
    case TRANSFER_METHOD_COPY_IMAGE:
      copyBufRegion.srcOffset = 1;
      copyBufRegion.dstOffset = 0x100000000;
      copyBufRegion.size = 0;
      (*pDVar5->_vptr_DeviceInterface[0x60])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,CONCAT44(uVar10,1),&copyBufRegion);
      break;
    case TRANSFER_METHOD_BLIT_IMAGE:
      copyBufRegion.srcOffset = 1;
      copyBufRegion.dstOffset = 0x100000000;
      copyBufRegion.size = 0;
      (*pDVar5->_vptr_DeviceInterface[0x61])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,CONCAT44(uVar10,1),&copyBufRegion,0);
      break;
    case TRANSFER_METHOD_COPY_BUFFER_TO_IMAGE:
      copyBufRegion.srcOffset = 0;
      copyBufRegion.size = 1;
      copyBufRegion.dstOffset = VVar3;
      (*pDVar5->_vptr_DeviceInterface[0x62])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,1,&copyBufRegion);
      break;
    case TRANSFER_METHOD_COPY_IMAGE_TO_BUFFER:
      copyBufRegion.srcOffset = 0;
      copyBufRegion.size = 1;
      copyBufRegion.dstOffset = VVar2;
      (*pDVar5->_vptr_DeviceInterface[99])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,1,&copyBufRegion);
      break;
    case TRANSFER_METHOD_UPDATE_BUFFER:
      copyBufRegion.srcOffset = 0xabcdef00deadbeef;
      copyBufRegion.dstOffset = CONCAT44(copyBufRegion.dstOffset._4_4_,0x12345678);
      (*pDVar5->_vptr_DeviceInterface[100])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0x10,0xc);
      break;
    case TRANSFER_METHOD_FILL_BUFFER:
      (*pDVar5->_vptr_DeviceInterface[0x65])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,this->m_bufSize,0);
      break;
    case TRANSFER_METHOD_CLEAR_COLOR_IMAGE:
      (*pDVar5->_vptr_DeviceInterface[0x66])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,&srcClearValue,1,pVVar9);
      break;
    case TRANSFER_METHOD_CLEAR_DEPTH_STENCIL_IMAGE:
      uVar11 = subRangeDepth._8_8_;
      dVar12 = subRangeDepth.layerCount;
      (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
                (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1);
      copyBufRegion.srcOffset = 0x3f800000;
      (*pDVar5->_vptr_DeviceInterface[0x67])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,&copyBufRegion,1,&subRangeDepth,uVar11,dVar12);
      break;
    case TRANSFER_METHOD_RESOLVE_IMAGE:
      copyBufRegion.srcOffset = 1;
      copyBufRegion.dstOffset = 0x100000000;
      copyBufRegion.size = 0;
      uVar11 = subRangeColor._8_8_;
      dVar12 = subRangeColor.layerCount;
      (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
                (this,(this->super_TimestampTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1);
      (*pDVar5->_vptr_DeviceInterface[0x66])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,&srcClearValue,1,pVVar9,uVar11,dVar12);
      (*pDVar5->_vptr_DeviceInterface[0x69])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,
                 (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                 m_internal,1,CONCAT44((int)((ulong)pVVar9 >> 0x20),1),&copyBufRegion);
      break;
    case TRANSFER_METHOD_COPY_QUERY_POOL_RESULTS:
      (*pDVar5->_vptr_DeviceInterface[0x71])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0);
      (*pDVar5->_vptr_DeviceInterface[0x72])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,1,
                 (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,8,3);
      (*pDVar5->_vptr_DeviceInterface[0x70])
                (pDVar5,(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (this->super_TimestampTestInstance).m_queryPool.
                 super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,1);
    }
  }
  uVar7 = 0;
  for (pVVar6 = (this->super_TimestampTestInstance).m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = (this->super_TimestampTestInstance).m_cmdBuffer.
               super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
      pVVar6 != (this->super_TimestampTestInstance).m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar6 = pVVar6 + 1) {
    (*pDVar5->_vptr_DeviceInterface[0x71])
              (pDVar5,pVVar1,(ulong)*pVVar6,
               (this->super_TimestampTestInstance).m_queryPool.
               super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,(ulong)uVar7)
    ;
    uVar7 = uVar7 + 1;
  }
  VVar4 = (*pDVar5->_vptr_DeviceInterface[0x4a])(pDVar5,pVVar1);
  ::vk::checkResult(VVar4,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x836);
  return;
}

Assistant:

void TransferTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCmdBufferOptimizeFlags         flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	// Initialize buffer/image
	vk.cmdFillBuffer(*m_cmdBuffer, *m_dstBuffer, 0u, m_bufSize, 0x0);

	const VkClearColorValue srcClearValue =
	{
		{1.0f, 1.0f, 1.0f, 1.0f}
	};
	const VkClearColorValue dstClearValue =
	{
		{0.0f, 0.0f, 0.0f, 0.0f}
	};
	const struct VkImageSubresourceRange subRangeColor =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,  // VkImageAspectFlags  aspectMask;
		0u,                         // deUint32            baseMipLevel;
		1u,                         // deUint32            mipLevels;
		0u,                         // deUint32            baseArrayLayer;
		1u,                         // deUint32            arraySize;
	};
	const struct VkImageSubresourceRange subRangeDepth =
	{
		VK_IMAGE_ASPECT_DEPTH_BIT,  // VkImageAspectFlags  aspectMask;
		0u,                  // deUint32            baseMipLevel;
		1u,                  // deUint32            mipLevels;
		0u,                  // deUint32            baseArrayLayer;
		1u,                  // deUint32            arraySize;
	};

	initialImageTransition(*m_cmdBuffer, *m_srcImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);
	initialImageTransition(*m_cmdBuffer, *m_dstImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);

	vk.cmdClearColorImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
	vk.cmdClearColorImage(*m_cmdBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, &dstClearValue, 1u, &subRangeColor);

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	// Copy Operations
	const VkImageSubresourceLayers imgSubResCopy =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,              // VkImageAspectFlags  aspectMask;
		0u,                                     // deUint32            mipLevel;
		0u,                                     // deUint32            baseArrayLayer;
		1u,                                     // deUint32            layerCount;
	};

	const VkOffset3D nullOffset  = {0u, 0u, 0u};
	const VkExtent3D imageExtent = {(deUint32)m_imageWidth, (deUint32)m_imageHeight, 1u};
	const VkOffset3D imageOffset = {(int)m_imageWidth, (int)m_imageHeight, 1};
	switch(m_method)
	{
		case TRANSFER_METHOD_COPY_BUFFER:
			{
				const VkBufferCopy  copyBufRegion =
				{
					0u,      // VkDeviceSize    srcOffset;
					0u,      // VkDeviceSize    destOffset;
					512u,    // VkDeviceSize    copySize;
				};
				vk.cmdCopyBuffer(*m_cmdBuffer, *m_srcBuffer, *m_dstBuffer, 1u, &copyBufRegion);
				break;
			}
		case TRANSFER_METHOD_COPY_IMAGE:
			{
				const VkImageCopy copyImageRegion =
				{
					imgSubResCopy,                          // VkImageSubresourceCopy  srcSubresource;
					nullOffset,                             // VkOffset3D              srcOffset;
					imgSubResCopy,                          // VkImageSubresourceCopy  destSubresource;
					nullOffset,                             // VkOffset3D              destOffset;
					imageExtent,                            // VkExtent3D              extent;

				};
				vk.cmdCopyImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &copyImageRegion);
				break;
			}
		case TRANSFER_METHOD_COPY_BUFFER_TO_IMAGE:
			{
				const VkBufferImageCopy bufImageCopy =
				{
					0u,                                     // VkDeviceSize            bufferOffset;
					(deUint32)m_imageWidth,                 // deUint32                bufferRowLength;
					(deUint32)m_imageHeight,                // deUint32                bufferImageHeight;
					imgSubResCopy,                          // VkImageSubresourceCopy  imageSubresource;
					nullOffset,                             // VkOffset3D              imageOffset;
					imageExtent,                            // VkExtent3D              imageExtent;
				};
				vk.cmdCopyBufferToImage(*m_cmdBuffer, *m_srcBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &bufImageCopy);
				break;
			}
		case TRANSFER_METHOD_COPY_IMAGE_TO_BUFFER:
			{
				const VkBufferImageCopy imgBufferCopy =
				{
					0u,                                     // VkDeviceSize            bufferOffset;
					(deUint32)m_imageWidth,                 // deUint32                bufferRowLength;
					(deUint32)m_imageHeight,                // deUint32                bufferImageHeight;
					imgSubResCopy,                          // VkImageSubresourceCopy  imageSubresource;
					nullOffset,                             // VkOffset3D              imageOffset;
					imageExtent,                            // VkExtent3D              imageExtent;
				};
				vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstBuffer, 1u, &imgBufferCopy);
				break;
			}
		case TRANSFER_METHOD_BLIT_IMAGE:
			{
				const VkImageBlit imageBlt =
				{
					imgSubResCopy,                          // VkImageSubresourceCopy  srcSubresource;
					{
						nullOffset,
						imageOffset,
					},
					imgSubResCopy,                          // VkImageSubresourceCopy  destSubresource;
					{
						nullOffset,
						imageOffset,
					}
				};
				vk.cmdBlitImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &imageBlt, VK_FILTER_NEAREST);
				break;
			}
		case TRANSFER_METHOD_CLEAR_COLOR_IMAGE:
			{
				vk.cmdClearColorImage(*m_cmdBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
				break;
			}
		case TRANSFER_METHOD_CLEAR_DEPTH_STENCIL_IMAGE:
			{
				initialImageTransition(*m_cmdBuffer, *m_depthImage, subRangeDepth, VK_IMAGE_LAYOUT_GENERAL);
				const VkClearDepthStencilValue clearDSValue =
				{
					1.0f,                                   // float       depth;
					0u,                                     // deUint32    stencil;
				};
				vk.cmdClearDepthStencilImage(*m_cmdBuffer, *m_depthImage, VK_IMAGE_LAYOUT_GENERAL, &clearDSValue, 1u, &subRangeDepth);
				break;
			}
		case TRANSFER_METHOD_FILL_BUFFER:
			{
				vk.cmdFillBuffer(*m_cmdBuffer, *m_dstBuffer, 0u, m_bufSize, 0x0);
				break;
			}
		case TRANSFER_METHOD_UPDATE_BUFFER:
			{
				const deUint32 data[] =
				{
					0xdeadbeef, 0xabcdef00, 0x12345678
				};
				vk.cmdUpdateBuffer(*m_cmdBuffer, *m_dstBuffer, 0x10, sizeof(data), data);
				break;
			}
		case TRANSFER_METHOD_COPY_QUERY_POOL_RESULTS:
			{
				vk.cmdWriteTimestamp(*m_cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, *m_queryPool, 0u);
				vk.cmdCopyQueryPoolResults(*m_cmdBuffer, *m_queryPool, 0u, 1u, *m_dstBuffer, 0u, 8u, VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);
				vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, 1u);
				break;
			}
		case TRANSFER_METHOD_RESOLVE_IMAGE:
			{
				const VkImageResolve imageResolve =
				{
					imgSubResCopy,                              // VkImageSubresourceLayers  srcSubresource;
					nullOffset,                                 // VkOffset3D                srcOffset;
					imgSubResCopy,                              // VkImageSubresourceLayers  destSubresource;
					nullOffset,                                 // VkOffset3D                destOffset;
					imageExtent,                                // VkExtent3D                extent;
				};
				initialImageTransition(*m_cmdBuffer, *m_msImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);
				vk.cmdClearColorImage(*m_cmdBuffer, *m_msImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
				vk.cmdResolveImage(*m_cmdBuffer, *m_msImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &imageResolve);
				break;
			}
		default:
			DE_FATAL("Unknown Transfer Method!");
			break;
	};

	deUint32 timestampEntry = 0u;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}